

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_3,_3>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_3,_3>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_> *dst)

{
  int row_1;
  long lVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_68;
  value_type local_48;
  
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_68);
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar5 = 0;
    do {
      local_48.m_data.m_data[1].m_data[1] = 0.0;
      local_48.m_data.m_data[1].m_data[2] = 0.0;
      local_48.m_data.m_data[2].m_data[0] = 0.0;
      local_48.m_data.m_data[2].m_data[1] = 0.0;
      local_48.m_data.m_data[0].m_data[0] = 0.0;
      local_48.m_data.m_data[0].m_data[1] = 0.0;
      local_48.m_data.m_data[0].m_data[2] = 0.0;
      local_48.m_data.m_data[1].m_data[0] = 0.0;
      local_48.m_data.m_data[2].m_data[2] = 0.0;
      lVar1 = 0;
      lVar3 = 0;
      pfVar2 = (float *)&local_48;
      do {
        lVar4 = 0;
        do {
          if (lVar1 == lVar4) {
            fVar6 = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
          }
          else {
            fVar6 = 0.0;
          }
          *(float *)((long)pfVar2 + lVar4) = fVar6;
          lVar4 = lVar4 + 0xc;
        } while (lVar4 != 0x24);
        lVar3 = lVar3 + 1;
        pfVar2 = pfVar2 + 1;
        lVar1 = lVar1 + 0xc;
      } while (lVar3 != 3);
      std::vector<tcu::Matrix<float,3,3>,std::allocator<tcu::Matrix<float,3,3>>>::
      emplace_back<tcu::Matrix<float,3,3>>
                ((vector<tcu::Matrix<float,3,3>,std::allocator<tcu::Matrix<float,3,3>>> *)dst,
                 &local_48);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  local_48.m_data.m_data[1].m_data[2] = 0.0;
  local_48.m_data.m_data[2].m_data[1] = 0.0;
  local_48.m_data.m_data[2].m_data[2] = 0.0;
  local_48.m_data.m_data[0].m_data[1] = 0.0;
  local_48.m_data.m_data[1].m_data[0] = 0.0;
  lVar1 = 0;
  do {
    local_48.m_data.m_data[0].m_data[lVar1] = 0.0;
    local_48.m_data.m_data[1].m_data[lVar1] = 0.0;
    local_48.m_data.m_data[2].m_data[lVar1] = 0.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_48.m_data.m_data[0].m_data[0] = 1.0;
  local_48.m_data.m_data[2].m_data[0] = 1.0;
  local_48.m_data.m_data[1].m_data[1] = 2.0;
  local_48.m_data.m_data[0].m_data[2] = 4.0;
  std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::push_back
            (dst,&local_48);
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}